

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O0

void dispatch_message(skynet_context *ctx,skynet_message *msg)

{
  uint type_00;
  int iVar1;
  ulong sz_00;
  size_t sz;
  int type;
  skynet_message *msg_local;
  skynet_context *ctx_local;
  
  if ((ctx->init & 1U) != 0) {
    pthread_setspecific(G_NODE.handle_key,(void *)(ulong)ctx->handle);
    type_00 = (uint)(byte)(msg->sz >> 0x38);
    sz_00 = msg->sz & 0xffffffffffffff;
    if (ctx->logfile != (FILE *)0x0) {
      skynet_log_output(ctx->logfile,msg->source,type_00,msg->session,msg->data,sz_00);
    }
    iVar1 = (*ctx->cb)(ctx,ctx->cb_ud,type_00,msg->session,msg->source,msg->data,sz_00);
    if (iVar1 == 0) {
      free(msg->data);
    }
    return;
  }
  __assert_fail("ctx->init",
                "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_server.c"
                ,0xfb,"void dispatch_message(struct skynet_context *, struct skynet_message *)");
}

Assistant:

static void
dispatch_message(struct skynet_context *ctx, struct skynet_message *msg) {
	assert(ctx->init);
	CHECKCALLING_BEGIN(ctx)
	pthread_setspecific(G_NODE.handle_key, (void *)(uintptr_t)(ctx->handle));
	int type = msg->sz >> MESSAGE_TYPE_SHIFT;
	size_t sz = msg->sz & MESSAGE_TYPE_MASK;
	if (ctx->logfile) {
		skynet_log_output(ctx->logfile, msg->source, type, msg->session, msg->data, sz);
	}
	if (!ctx->cb(ctx, ctx->cb_ud, type, msg->session, msg->source, msg->data, sz)) {
		skynet_free(msg->data);
	} 
	CHECKCALLING_END(ctx)
}